

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O2

exr_result_t exr_attr_set_m33f(exr_context_t ctxt,int part_index,char *name,exr_attr_m33f_t *val)

{
  pthread_mutex_t *__mutex;
  exr_attr_m33d_t *peVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  exr_result_t eVar5;
  _func_exr_result_t_exr_const_context_t_exr_result_t *UNRECOVERED_JUMPTABLE;
  char *pcVar6;
  exr_context_t nonc;
  char *pcVar7;
  exr_attribute_list_t *list;
  exr_result_t eStackY_50;
  exr_attribute_t *attr;
  
  attr = (exr_attribute_t *)0x0;
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  __mutex = &ctxt->mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if ((part_index < 0) || (ctxt->num_parts <= part_index)) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    eVar5 = (*ctxt->print_error)
                      (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                       ctxt->print_error);
    return eVar5;
  }
  if (ctxt->mode == '\x03') {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eStackY_50 = 0x15;
LAB_0011bb20:
    eVar5 = (*UNRECOVERED_JUMPTABLE)(ctxt,eStackY_50);
    return eVar5;
  }
  if (ctxt->mode == '\0') {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eStackY_50 = 8;
    goto LAB_0011bb20;
  }
  list = &ctxt->parts[(uint)part_index]->attributes;
  eVar5 = exr_attr_list_find_by_name(ctxt,list,name,&attr);
  if (eVar5 == 0) {
    if (attr->type != EXR_ATTR_M33F) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      pcVar7 = attr->type_name;
      pcVar6 = "\'%s\' requested type \'m33f\', but stored attributes is type \'%s\'";
      eVar5 = 0x10;
      goto LAB_0011bc17;
    }
    if (val == (exr_attr_m33f_t *)0x0) goto LAB_0011bbff;
  }
  else {
    if (eVar5 != 0xf) goto LAB_0011bbd6;
    if ((ctxt->mode != '\x01') && (ctxt->mode != '\x04')) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return 0xf;
    }
    eVar5 = exr_attr_list_add(ctxt,list,name,EXR_ATTR_M33F,0,(uint8_t **)0x0,&attr);
    if (val == (exr_attr_m33f_t *)0x0) {
LAB_0011bbff:
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      pcVar6 = "No input value for setting \'%s\', type \'%s\'";
      pcVar7 = "m33f";
      eVar5 = 3;
LAB_0011bc17:
      eVar5 = (*ctxt->print_error)(ctxt,eVar5,pcVar6,name,pcVar7);
      return eVar5;
    }
    if (eVar5 != 0) goto LAB_0011bbd6;
  }
  peVar1 = (attr->field_6).m33d;
  *(float *)(peVar1->m + 4) = val->m[8];
  dVar2 = *(double *)val->m;
  dVar3 = *(double *)(val->m + 2);
  dVar4 = *(double *)(val->m + 6);
  peVar1->m[2] = *(double *)(val->m + 4);
  peVar1->m[3] = dVar4;
  peVar1->m[0] = dVar2;
  peVar1->m[1] = dVar3;
  eVar5 = 0;
LAB_0011bbd6:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return eVar5;
}

Assistant:

exr_result_t
exr_attr_set_m33f (
    exr_context_t          ctxt,
    int                    part_index,
    const char*            name,
    const exr_attr_m33f_t* val)
{
    ATTR_SET_IMPL_DEREF (EXR_ATTR_M33F, m33f);
}